

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::base::UnixSocket::OnEvent(UnixSocket *this)

{
  EventListener *pEVar1;
  TaskRunner *task_runner;
  bool bVar2;
  SocketHandle __fd;
  int iVar3;
  SockFamily sock_family;
  SockType sock_type;
  UnixSocket *this_00;
  unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_> local_60;
  undefined1 local_55;
  ScopedResource<int,_&perfetto::base::CloseFile,__1,_true,_perfetto::base::internal::DefaultValidityChecker<int,__1>_>
  local_54;
  unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_> local_50;
  unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_> new_sock;
  anon_class_8_1_8991fb9c local_38;
  ScopedResource<int,_&perfetto::base::CloseFile,__1,_true,_perfetto::base::internal::DefaultValidityChecker<int,__1>_>
  local_2c;
  char *pcStack_28;
  ScopedFile new_fd;
  socklen_t local_18;
  int res;
  socklen_t err_len;
  int sock_err;
  UnixSocket *this_local;
  
  if (this->state_ != kDisconnected) {
    _err_len = this;
    if (this->state_ == kConnected) {
      (*this->event_listener_->_vptr_EventListener[5])();
    }
    else if (this->state_ == kConnecting) {
      res = 0x16;
      local_18 = 4;
      __fd = UnixSocketRaw::fd(&this->sock_raw_);
      iVar3 = getsockopt(__fd,1,4,&res,&local_18);
      if ((iVar3 != 0) || (res != 0x73)) {
        if ((iVar3 == 0) && (res == 0)) {
          if (this->peer_cred_mode_ == kDefault) {
            ReadPeerCredentialsPosix(this);
          }
          this->state_ = kConnected;
          (*this->event_listener_->_vptr_EventListener[3])(this->event_listener_,this,1);
        }
        else {
          pcStack_28 = strerror(res);
          ignore_result<char[21],char*>
                    ((char (*) [21])"Connection error: %s",&stack0xffffffffffffffd8);
          Shutdown(this,false);
          (*this->event_listener_->_vptr_EventListener[3])(this->event_listener_,this,0);
        }
      }
    }
    else if (this->state_ == kListening) {
      do {
        local_38.this = this;
        iVar3 = OnEvent::anon_class_8_1_8991fb9c::operator()(&local_38);
        ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
        ::ScopedResource(&local_2c,iVar3);
        bVar2 = ScopedResource::operator_cast_to_bool((ScopedResource *)&local_2c);
        if (bVar2) {
          this_00 = (UnixSocket *)operator_new(0x40);
          local_55 = 1;
          pEVar1 = this->event_listener_;
          task_runner = this->task_runner_;
          ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
          ::ScopedResource(&local_54,&local_2c);
          sock_family = UnixSocketRaw::family(&this->sock_raw_);
          sock_type = UnixSocketRaw::type(&this->sock_raw_);
          UnixSocket(this_00,pEVar1,task_runner,&local_54,kConnected,sock_family,sock_type,
                     this->peer_cred_mode_);
          local_55 = 0;
          ::std::
          unique_ptr<perfetto::base::UnixSocket,std::default_delete<perfetto::base::UnixSocket>>::
          unique_ptr<std::default_delete<perfetto::base::UnixSocket>,void>
                    ((unique_ptr<perfetto::base::UnixSocket,std::default_delete<perfetto::base::UnixSocket>>
                      *)&local_50,this_00);
          ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
          ::~ScopedResource(&local_54);
          pEVar1 = this->event_listener_;
          std::
          unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>::
          unique_ptr(&local_60,&local_50);
          (*pEVar1->_vptr_EventListener[2])(pEVar1,this,&local_60);
          std::
          unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>::
          ~unique_ptr(&local_60);
          std::
          unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>::
          ~unique_ptr(&local_50);
        }
        new_sock._M_t.
        super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
        ._M_t.
        super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
        .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl._1_3_ = 0;
        new_sock._M_t.
        super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
        ._M_t.
        super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
        .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl._0_1_ = !bVar2;
        ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
        ::~ScopedResource(&local_2c);
      } while ((uint)new_sock._M_t.
                     super___uniq_ptr_impl<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_perfetto::base::UnixSocket_*,_std::default_delete<perfetto::base::UnixSocket>_>
                     .super__Head_base<0UL,_perfetto::base::UnixSocket_*,_false>._M_head_impl == 0);
    }
  }
  return;
}

Assistant:

void UnixSocket::OnEvent() {
  if (state_ == State::kDisconnected)
    return;  // Some spurious event, typically queued just before Shutdown().

  if (state_ == State::kConnected)
    return event_listener_->OnDataAvailable(this);

  if (state_ == State::kConnecting) {
    PERFETTO_DCHECK(sock_raw_);
    int sock_err = EINVAL;
    socklen_t err_len = sizeof(sock_err);
    int res =
        getsockopt(sock_raw_.fd(), SOL_SOCKET, SO_ERROR, &sock_err, &err_len);

    if (res == 0 && sock_err == EINPROGRESS)
      return;  // Not connected yet, just a spurious FD watch wakeup.
    if (res == 0 && sock_err == 0) {
      if (peer_cred_mode_ == SockPeerCredMode::kReadOnConnect)
        ReadPeerCredentialsPosix();
      state_ = State::kConnected;
      return event_listener_->OnConnect(this, true /* connected */);
    }
    PERFETTO_DLOG("Connection error: %s", strerror(sock_err));
    Shutdown(false);
    return event_listener_->OnConnect(this, false /* connected */);
  }

  // New incoming connection.
  if (state_ == State::kListening) {
    // There could be more than one incoming connection behind each FD watch
    // notification. Drain'em all.
    for (;;) {
      ScopedFile new_fd(
          PERFETTO_EINTR(accept(sock_raw_.fd(), nullptr, nullptr)));
      if (!new_fd)
        return;
      std::unique_ptr<UnixSocket> new_sock(new UnixSocket(
          event_listener_, task_runner_, std::move(new_fd), State::kConnected,
          sock_raw_.family(), sock_raw_.type(), peer_cred_mode_));
      event_listener_->OnNewIncomingConnection(this, std::move(new_sock));
    }
  }
}